

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O2

Vec_Int_t * Pdr_InvCounts(Vec_Int_t *vInv)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int i;
  Vec_Int_t *p;
  long lVar4;
  int Addition;
  long lVar5;
  
  piVar1 = vInv->pArray;
  iVar3 = Vec_IntEntryLast(vInv);
  p = Vec_IntStart(iVar3);
  piVar2 = piVar1;
  for (iVar3 = 0; iVar3 < *piVar1; iVar3 = iVar3 + 1) {
    for (lVar5 = 0; lVar4 = (long)piVar2[1], lVar5 < lVar4; lVar5 = lVar5 + 1) {
      i = Abc_Lit2Var(piVar2[lVar5 + 2]);
      Vec_IntAddToEntry(p,i,Addition);
    }
    piVar2 = piVar2 + 1 + lVar4;
  }
  return p;
}

Assistant:

Vec_Int_t * Pdr_InvCounts( Vec_Int_t * vInv )
{
    int i, k, * pCube, * pList = Vec_IntArray(vInv);
    Vec_Int_t * vCounts = Vec_IntStart( Vec_IntEntryLast(vInv) );
    Pdr_ForEachCube( pList, pCube, i )
        for ( k = 0; k < pCube[0]; k++ )
            Vec_IntAddToEntry( vCounts, Abc_Lit2Var(pCube[k+1]), 1 );
    return vCounts;
}